

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall Timer::Tick(Timer *this)

{
  TimeEvent *pTVar1;
  int iVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  double dVar5;
  TimeEvent *timer;
  Timer *local_40;
  double local_38;
  
  local_38 = GetTime();
  if (this->changed == true) {
    std::
    _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
    ::operator=(&(this->execlist)._M_t,&(this->timers)._M_t);
    this->changed = false;
  }
  local_40 = this;
  for (p_Var4 = (this->execlist)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->execlist)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    timer = *(TimeEvent **)(p_Var4 + 1);
    iVar3 = std::
            _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
            ::find(&(this->timers)._M_t,&timer);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->timers)._M_t._M_impl.super__Rb_tree_header) {
      dVar5 = timer->lasttime + timer->speed;
      if (dVar5 < local_38) {
        timer->lasttime = dVar5;
        if ((timer->lifetime != -1) &&
           (iVar2 = timer->lifetime + -1, timer->lifetime = iVar2, iVar2 == 0)) {
          Unregister(local_40,timer);
        }
        (*timer->callback)(timer->param);
        pTVar1 = timer;
        if (timer->manager == (Timer *)0x0) {
          TimeEvent::~TimeEvent(timer);
          operator_delete(pTVar1,0x30);
        }
      }
    }
  }
  return;
}

Assistant:

void Timer::Tick()
{
	double currenttime = Timer::GetTime();

	if (this->changed)
	{
		this->execlist = this->timers;
		this->changed = false;
	}

	UTIL_FOREACH(this->execlist, timer)
	{
		if (this->timers.find(timer) == this->timers.end())
			continue;

		if (timer->lasttime + timer->speed < currenttime)
		{
			timer->lasttime += timer->speed;

			if (timer->lifetime != Timer::FOREVER)
			{
				--timer->lifetime;

				if (timer->lifetime == 0)
				{
					this->Unregister(timer);
				}
			}

#ifndef DEBUG_EXCEPTIONS
			try
			{
#endif // DEBUG_EXCEPTIONS
				timer->callback(timer->param);
#ifndef DEBUG_EXCEPTIONS
			}
			catch (Socket_Exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("%s: %s", e.what(), e.error());
			}
			catch (Database_Exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("%s: %s", e.what(), e.error());
			}
			catch (std::runtime_error& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Runtime Error: %s", e.what());
			}
			catch (std::logic_error& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Logic Error: %s", e.what());
			}
			catch (std::exception& e)
			{
				Console::Err("Timer callback caused an exception");
				Console::Err("Uncaught Exception: %s", e.what());
			}
			catch (...)
			{
				Console::Err("Timer callback caused an exception");
			}
#endif // DEBUG_EXCEPTIONS

			if (timer->manager == 0)
				delete timer;
		}
	}
}